

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

uint32 __thiscall Clasp::Solver::undoUntilImpl(Solver *this,uint32 level,bool forceSave)

{
  uint32 *puVar1;
  pointer pDVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  bool bVar7;
  bool bVar8;
  
  uVar5 = *(uint *)&(this->levels_).field_0x14 & 0x3fffffff;
  if (uVar5 <= level) {
    uVar5 = level;
  }
  uVar3 = (this->levels_).super_type.ebo_.size;
  uVar4 = uVar3 - uVar5;
  if (uVar5 <= uVar3 && uVar4 != 0) {
    (this->levels_).jump = uVar4;
    bVar7 = true;
    if (!forceSave) {
      if (*(uint *)&this->strategy_ < 0x10000) {
        bVar7 = false;
      }
      else {
        bVar7 = *(uint *)&this->strategy_ >> 0x10 <= uVar4;
      }
    }
    pDVar2 = (this->levels_).super_type.ebo_.buf;
    if ((this->conflict_).ebo_.size == 0) {
      bVar8 = -1 < *(int *)(pDVar2 + (uVar3 - 1));
    }
    else {
      bVar8 = false;
    }
    (this->conflict_).ebo_.size = 0;
    plVar6 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
    (**(code **)(*plVar6 + 0x40))(plVar6,this,*(uint *)(pDVar2 + uVar5) & 0x3fffffff);
    bVar8 = (bool)(bVar8 & bVar7);
    do {
      undoLevel(this,bVar8);
      puVar1 = &(this->levels_).jump;
      *puVar1 = *puVar1 - 1;
      uVar3 = uVar5;
      bVar8 = bVar7;
    } while (*puVar1 != 0);
  }
  return uVar3;
}

Assistant:

uint32 Solver::undoUntilImpl(uint32 level, bool forceSave) {
	level      = std::max( level, backtrackLevel() );
	if (level >= decisionLevel()) { return decisionLevel(); }
	uint32& n  = (levels_.jump = decisionLevel() - level);
	bool sp    = forceSave || (strategy_.saveProgress > 0 && ((uint32)strategy_.saveProgress) <= n);
	bool ok    = conflict_.empty() && levels_.back().freeze == 0;
	conflict_.clear();
	heuristic_->undoUntil( *this, levels_[level].trailPos);
	undoLevel(sp && ok);
	while (--n) { undoLevel(sp); }
	return level;
}